

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

XMLCh * __thiscall PSVIWriterHandlers::getIdName(PSVIWriterHandlers *this,XSObject *obj)

{
  wchar16 *toAdd;
  char16_t *valueToAdopt;
  
  toAdd = (wchar16 *)operator_new__(0x12);
  xercesc_4_0::XMLString::sizeToText
            ((ulong)obj,toAdd,8,0x10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  valueToAdopt = xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                           (this->fIdMap,toAdd);
  if (valueToAdopt == (char16_t *)0x0) {
    valueToAdopt = createID(this,obj);
    xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::put
              (this->fIdMap,toAdd,valueToAdopt);
    xercesc_4_0::BaseRefVectorOf<char16_t>::addElement
              (&this->fObjectLocations->super_BaseRefVectorOf<char16_t>,toAdd);
  }
  else {
    operator_delete__(toAdd);
  }
  return valueToAdopt;
}

Assistant:

const XMLCh* PSVIWriterHandlers::getIdName(XSObject* obj) {
	XMLCh* objLoc = new XMLCh[9];
	XMLString::sizeToText((XMLSize_t)obj, objLoc, 8, 16);
	XMLCh* idName = fIdMap->get(objLoc);
	if (!idName) {
		idName = createID(obj);
		fIdMap->put(objLoc, idName);
		fObjectLocations->addElement(objLoc);
	} else {
		delete[] objLoc;
	}
	return idName;
}